

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
HomExtDirFill::operator()
          (HomExtDirFill *this,IntVect *iv,Array4<double> *dest,int dcomp,int numcomp,
          GeometryData *geom,Real param_7,BCRec *bcr,int param_9,int param_10)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  int in_ECX;
  long *in_RDX;
  int *in_RSI;
  int in_R8D;
  long in_R9;
  long in_stack_00000008;
  int idir;
  int *bc;
  int n;
  int *domhi;
  int *domlo;
  int local_14c;
  int local_13c;
  
  piVar1 = amrex::Box::loVect((Box *)(in_R9 + 0x30));
  piVar2 = amrex::Box::hiVect((Box *)(in_R9 + 0x30));
  for (local_13c = 0; local_13c < in_R8D; local_13c = local_13c + 1) {
    lVar3 = in_stack_00000008 + (long)local_13c * 0x18;
    for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
      if (*(int *)(lVar3 + (long)local_14c * 4) == 3) {
        if (in_RSI[local_14c] < piVar1[local_14c]) {
          *(undefined8 *)
           (*in_RDX +
           ((long)(*in_RSI - (int)in_RDX[4]) +
            (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
            (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)(in_ECX + local_13c) * in_RDX[3])
           * 8) = 0;
        }
      }
      if (*(int *)(lVar3 + (long)(local_14c + 3) * 4) == 3) {
        if (piVar2[local_14c] < in_RSI[local_14c]) {
          *(undefined8 *)
           (*in_RDX +
           ((long)(*in_RSI - (int)in_RDX[4]) +
            (long)(in_RSI[1] - *(int *)((long)in_RDX + 0x24)) * in_RDX[1] +
            (long)(in_RSI[2] - (int)in_RDX[5]) * in_RDX[2] + (long)(in_ECX + local_13c) * in_RDX[3])
           * 8) = 0;
        }
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_DEVICE
    void operator() (const IntVect& iv, Array4<Real> const& dest,
                     const int dcomp, const int numcomp,
                     GeometryData const& geom, const Real /*time*/,
                     const BCRec* bcr, const int /*bcomp*/,
                     const int /*orig_comp*/) const
    {
       const int* domlo = geom.Domain().loVect();
       const int* domhi = geom.Domain().hiVect();
       for (int n = 0; n < numcomp; n++ ) {
          const int* bc = bcr[n].data();
          for (int idir = 0; idir < AMREX_SPACEDIM; idir++) {
             if ((bc[idir] == amrex::BCType::ext_dir) and (iv[idir] < domlo[idir])) {
                dest(iv, dcomp+n) = 0.0;
             }
             if ((bc[idir + AMREX_SPACEDIM] == amrex::BCType::ext_dir) and (iv[idir] > domhi[idir])) {
                dest(iv, dcomp+n) = 0.0;
             }
          }
       }
    }